

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree.cpp
# Opt level: O1

void print_block(Block *b,ProxyWithLink *cp,bool verbose)

{
  Link *pLVar1;
  pointer pBVar2;
  uint *puVar3;
  uint *puVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pSVar7;
  pointer pBVar8;
  ulong uVar9;
  long lVar10;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  long local_1a0;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_188;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_148;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_108;
  ulong local_c8 [2];
  ulong local_b8;
  ulong local_a8;
  ulong local_98;
  ulong local_88;
  ulong local_78;
  ulong local_68;
  ulong local_58;
  long local_48;
  
  pLVar1 = cp->link_;
  local_c8[0] = (ulong)(uint)(cp->super_Proxy).gid_;
  pBVar8 = pLVar1[7].neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pBVar2 = pLVar1[9].neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48 = (long)(b->points).
                   super__Vector_base<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(b->points).
                   super__Vector_base<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  local_b8 = (ulong)(uint)pBVar8->gid;
  local_a8 = (ulong)(uint)pBVar8->proc;
  local_98 = (ulong)(uint)pBVar8[1].gid;
  local_88 = (ulong)(uint)pBVar2->gid;
  local_78 = (ulong)(uint)pBVar2->proc;
  local_68 = (ulong)(uint)pBVar2[1].gid;
  local_58 = (ulong)((long)(pLVar1->neighbors_).
                           super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pLVar1->neighbors_).
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  format_str.size_ = 0x36;
  format_str.data_ = "{}: [{},{},{}] - [{},{},{}] ({} neighbors): {} points\n";
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       local_c8;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0x419999991;
  fmt::v7::vprint(_stdout,format_str,args);
  pBVar8 = (pLVar1->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pLVar1->neighbors_).
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pBVar8) >> 3)) {
    lVar10 = 0;
    local_1a0 = 0;
    do {
      itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                (&local_108,
                 (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                 ((long)&(pLVar1[2].neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage)->gid + lVar10),
                 (allocator<int> *)local_c8);
      piVar6 = local_108.m_begin;
      itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                (&local_148,
                 (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                 ((long)&(pLVar1[2].neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage)->gid + lVar10),
                 (allocator<int> *)local_c8);
      piVar5 = local_148.m_begin;
      itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                (&local_188,
                 (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                 ((long)&(pLVar1[2].neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage)->gid + lVar10),
                 (allocator<int> *)local_c8);
      local_c8[0] = (ulong)(uint)pBVar8[local_1a0].gid;
      local_b8 = (ulong)(uint)pBVar8[local_1a0].proc;
      local_a8 = (ulong)(uint)*piVar6;
      local_98 = (ulong)(uint)piVar5[1];
      local_88 = (ulong)(uint)local_188.m_begin[2];
      format_str_00.size_ = 0x15;
      format_str_00.data_ = "  ({},{},({},{},{})):";
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           local_c8;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = 0x11111;
      fmt::v7::vprint(_stdout,format_str_00,args_00);
      local_188.m_end = local_188.m_begin;
      if (local_188.m_dynamic_data != (pointer)0x0) {
        operator_delete(local_188.m_dynamic_data,local_188.m_dynamic_capacity << 2);
      }
      local_148.m_end = local_148.m_begin;
      if (local_148.m_dynamic_data != (pointer)0x0) {
        operator_delete(local_148.m_dynamic_data,local_148.m_dynamic_capacity << 2);
      }
      local_108.m_end = local_108.m_begin;
      if (local_108.m_dynamic_data != (pointer)0x0) {
        operator_delete(local_108.m_dynamic_data,local_108.m_dynamic_capacity << 2);
      }
      pBVar8 = pLVar1[0xc].neighbors_.
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = *(uint **)((long)&pBVar8[1].gid + lVar10 * 2);
      puVar4 = *(uint **)((long)&pBVar8[9].gid + lVar10 * 2);
      local_c8[0] = (ulong)*puVar3;
      local_b8 = (ulong)puVar3[1];
      local_a8 = (ulong)puVar3[2];
      local_98 = (ulong)*puVar4;
      local_88 = (ulong)puVar4[1];
      local_78 = (ulong)puVar4[2];
      format_str_01.size_ = 0x19;
      format_str_01.data_ = " [{},{},{}] - [{},{},{}]\n";
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           local_c8;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = 0x999999;
      fmt::v7::vprint(_stdout,format_str_01,args_01);
      local_1a0 = local_1a0 + 1;
      pBVar8 = (pLVar1->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x40;
    } while (local_1a0 <
             (int)((ulong)((long)(pLVar1->neighbors_).
                                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pBVar8) >> 3));
  }
  if ((verbose) &&
     (pSVar7 = (b->points).super__Vector_base<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
     (b->points).super__Vector_base<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>._M_impl.
     super__Vector_impl_data._M_finish != pSVar7)) {
    uVar9 = 0;
    do {
      local_c8[0] = (ulong)(uint)pSVar7[uVar9].coords[0];
      local_b8 = (ulong)(uint)pSVar7[uVar9].coords[1];
      local_a8 = (ulong)(uint)pSVar7[uVar9 + 1].coords[0];
      format_str_02.size_ = 0xb;
      format_str_02.data_ = "  {} {} {}\n";
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           local_c8;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = 0x999;
      fmt::v7::vprint(_stdout,format_str_02,args_02);
      uVar9 = uVar9 + 1;
      pSVar7 = (b->points).super__Vector_base<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(b->points).
                                   super__Vector_base<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7 >> 3));
  }
  return;
}

Assistant:

void print_block(Block* b, const diy::Master::ProxyWithLink& cp, bool verbose)
{
  RCLink*  link      = static_cast<RCLink*>(cp.link());

  fmt::print("{}: [{},{},{}] - [{},{},{}] ({} neighbors): {} points\n",
                  cp.gid(),
                  link->bounds().min[0], link->bounds().min[1], link->bounds().min[2],
                  link->bounds().max[0], link->bounds().max[1], link->bounds().max[2],
                  link->size(), b->points.size());

  for (int i = 0; i < link->size(); ++i)
  {
      fmt::print("  ({},{},({},{},{})):",
                      link->target(i).gid, link->target(i).proc,
                      link->direction(i)[0],
                      link->direction(i)[1],
                      link->direction(i)[2]);
      const Bounds& bounds = link->bounds(i);
      fmt::print(" [{},{},{}] - [{},{},{}]\n",
              bounds.min[0], bounds.min[1], bounds.min[2],
              bounds.max[0], bounds.max[1], bounds.max[2]);
  }

  if (verbose)
    for (size_t i = 0; i < b->points.size(); ++i)
      fmt::print("  {} {} {}\n", b->points[i][0], b->points[i][1], b->points[i][2]);
}